

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

uint64_t Assimp::FBX::ParseTokenAsID(Token *t,char **err_out)

{
  uint64_t uVar1;
  bool bVar2;
  TokenType TVar3;
  char *pcVar4;
  char *pcVar5;
  Token *pTVar6;
  uint64_t id;
  char *out;
  uint length;
  uint64_t id_1;
  char *data;
  char **err_out_local;
  Token *t_local;
  
  *err_out = (char *)0x0;
  data = (char *)err_out;
  err_out_local = &t->sbegin;
  TVar3 = Token::Type(t);
  if (TVar3 == TokenType_DATA) {
    bVar2 = Token::IsBinary((Token *)err_out_local);
    if (bVar2) {
      id_1 = (uint64_t)Token::begin((Token *)err_out_local);
      if (*(char *)id_1 == 'L') {
        pcVar4 = (char *)(id_1 + 1);
        pcVar5 = Token::end((Token *)err_out_local);
        t_local = (Token *)anon_unknown.dwarf_d3af7e::SafeParse<unsigned_long>(pcVar4,pcVar5);
      }
      else {
        *(char **)data = "failed to parse ID, unexpected data type, expected L(ong) (binary)";
        t_local = (Token *)0x0;
      }
    }
    else {
      pcVar4 = Token::end((Token *)err_out_local);
      pcVar5 = Token::begin((Token *)err_out_local);
      out._4_4_ = (int)pcVar4 - (int)pcVar5;
      id = 0;
      pcVar4 = Token::begin((Token *)err_out_local);
      pTVar6 = (Token *)strtoul10_64(pcVar4,(char **)&id,(uint *)((long)&out + 4));
      uVar1 = id;
      pcVar4 = Token::end((Token *)err_out_local);
      t_local = pTVar6;
      if (pcVar4 < uVar1) {
        *(char **)data = "failed to parse ID (text)";
        t_local = (Token *)0x0;
      }
    }
  }
  else {
    *(char **)data = "expected TOK_DATA token";
    t_local = (Token *)0x0;
  }
  return (uint64_t)t_local;
}

Assistant:

uint64_t ParseTokenAsID(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0L;
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'L') {
            err_out = "failed to parse ID, unexpected data type, expected L(ong) (binary)";
            return 0L;
        }

        BE_NCONST uint64_t id = SafeParse<uint64_t>(data+1, t.end());
        AI_SWAP8(id);
        return id;
    }

    // XXX: should use size_t here
    unsigned int length = static_cast<unsigned int>(t.end() - t.begin());
    ai_assert(length > 0);

    const char* out = nullptr;
    const uint64_t id = strtoul10_64(t.begin(),&out,&length);
    if (out > t.end()) {
        err_out = "failed to parse ID (text)";
        return 0L;
    }

    return id;
}